

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLABecLaplacian.cpp
# Opt level: O2

void __thiscall
amrex::MLABecLaplacian::averageDownCoeffsSameAmrLevel
          (MLABecLaplacian *this,int amrlev,
          Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *a,
          Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
          *b)

{
  FabArray<amrex::FArrayBox> *this_00;
  pointer pIVar1;
  pointer pMVar2;
  pointer paVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  double dVar17;
  initializer_list<const_amrex::MultiFab_*> __l;
  initializer_list<amrex::MultiFab_*> __l_00;
  Array4<const_int> local_1f8;
  long local_1b8;
  double local_1b0;
  Box local_1a4;
  Box local_188;
  Box local_16c;
  IntVect ratio;
  undefined4 uStack_144;
  long local_140;
  long local_138;
  int local_130;
  int local_12c;
  int local_128;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> crse;
  long local_f8;
  int local_f0;
  int local_ec;
  int local_e8;
  Array4<double> local_d0;
  Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> fine;
  int local_70;
  int local_68;
  
  lVar5 = (long)(int)(((long)(a->super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>).
                             super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(a->super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>).
                            super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                            _M_impl.super__Vector_impl_data._M_start) / 0x180);
  lVar9 = 0;
  lVar13 = 0;
  lVar11 = 0;
  for (lVar6 = 1; lVar6 < lVar5; lVar6 = lVar6 + 1) {
    if (amrlev < 1) {
      pIVar1 = (this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.mg_coarsen_ratio_vec.
               super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
               super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
               super__Vector_impl_data._M_start;
      ratio.vect[2] = *(int *)((long)pIVar1->vect + lVar13 + 8);
      ratio.vect._0_8_ = *(undefined8 *)((long)pIVar1->vect + lVar13);
    }
    else {
      ratio.vect._0_8_ = &DAT_200000002;
      ratio.vect[2] = 2;
    }
    pMVar2 = (a->super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>).
             super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
             super__Vector_impl_data._M_start;
    this_00 = (FabArray<amrex::FArrayBox> *)
              ((long)&pMVar2[1].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                      _vptr_FabArrayBase + lVar9);
    if ((this->m_a_scalar != 0.0) || (NAN(this->m_a_scalar))) {
      average_down((MultiFab *)
                   ((long)&(pMVar2->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                           _vptr_FabArrayBase + lVar9),(MultiFab *)this_00,0,1,&ratio);
    }
    else {
      FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>(this_00,0.0);
    }
    paVar3 = (b->
             super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
             ).
             super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    crse.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((long)&paVar3->_M_elems[0].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                          _vptr_FabArrayBase + lVar11);
    crse.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((long)&paVar3->_M_elems[1].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                          _vptr_FabArrayBase + lVar11);
    crse.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)((long)&paVar3->_M_elems[2].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                          _vptr_FabArrayBase + lVar11);
    __l._M_len = 3;
    __l._M_array = (iterator)&crse;
    std::vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::vector
              ((vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)&fine,
               __l,(allocator_type *)&local_d0);
    paVar3 = (b->
             super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
             ).
             super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_d0.p = (double *)
                 ((long)&paVar3[1]._M_elems[0].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                         _vptr_FabArrayBase + lVar11);
    local_d0.jstride =
         (long)&paVar3[1]._M_elems[1].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                _vptr_FabArrayBase + lVar11;
    local_d0.kstride =
         (long)&paVar3[1]._M_elems[2].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                _vptr_FabArrayBase + lVar11;
    __l_00._M_len = 3;
    __l_00._M_array = (iterator)&local_d0;
    std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
              ((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&crse,__l_00,
               (allocator_type *)&local_1f8);
    average_down_faces(&fine,&crse,&ratio,0);
    std::_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~_Vector_base
              ((_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&crse);
    std::_Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::
    ~_Vector_base((_Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *
                  )&fine);
    lVar11 = lVar11 + 0x480;
    lVar13 = lVar13 + 0xc;
    lVar9 = lVar9 + 0x180;
  }
  for (lVar6 = 1; lVar6 < lVar5; lVar6 = lVar6 + 1) {
    if (*(long *)(*(long *)&(this->super_MLCellABecLap).m_overset_mask.
                            super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                            .
                            super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[amrlev].
                            super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                            .
                            super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                 + lVar6 * 8) != 0) {
      dVar17 = (double)(1 << ((byte)lVar6 & 0x1f));
      local_1b0 = (dVar17 + dVar17) / (dVar17 + 1.0);
      uVar4 = (*(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp._vptr_MLLinOp[5])();
      MFIter::MFIter((MFIter *)&fine,
                     (FabArrayBase *)
                     ((a->super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>).
                      super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar6),true);
      if ((int)uVar4 < 1) {
        uVar4 = 0;
      }
      uVar15 = (ulong)uVar4;
      local_1b8 = lVar6 * 0x480;
      while (local_70 < local_68) {
        MFIter::nodaltilebox(&local_16c,(MFIter *)&fine,0);
        MFIter::nodaltilebox(&local_188,(MFIter *)&fine,1);
        MFIter::nodaltilebox(&local_1a4,(MFIter *)&fine,2);
        lVar9 = local_1b8;
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)&crse,
                   (FabArray<amrex::FArrayBox> *)
                   ((long)&((b->
                            super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                            ).
                            super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_elems[0].
                           super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase +
                   local_1b8),(MFIter *)&fine);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_d0,
                   (FabArray<amrex::FArrayBox> *)
                   ((long)&((b->
                            super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                            ).
                            super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_elems[1].
                           super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase +
                   lVar9),(MFIter *)&fine);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)&ratio,
                   (FabArray<amrex::FArrayBox> *)
                   ((long)&((b->
                            super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                            ).
                            super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_elems[2].
                           super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase +
                   lVar9),(MFIter *)&fine);
        FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                  (&local_1f8,
                   *(FabArray<amrex::IArrayBox> **)
                    (*(long *)&(this->super_MLCellABecLap).m_overset_mask.
                               super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                               .
                               super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[amrlev].
                               super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                               .
                               super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                    + lVar6 * 8),(MFIter *)&fine);
        lVar9 = (long)local_16c.smallend.vect[0];
        lVar11 = 0;
        for (uVar8 = 0; lVar13 = (long)local_16c.smallend.vect[2], uVar8 != uVar15;
            uVar8 = uVar8 + 1) {
          for (; lVar16 = (long)local_16c.smallend.vect[1], (int)lVar13 <= local_16c.bigend.vect[2];
              lVar13 = lVar13 + 1) {
            for (; (int)lVar16 <= local_16c.bigend.vect[1]; lVar16 = lVar16 + 1) {
              lVar12 = local_f8 * lVar11 +
                       (lVar16 - local_ec) *
                       (long)crse.
                             super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                             super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish * 8 +
                       (lVar13 - local_e8) *
                       (long)crse.
                             super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                             super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage * 8 +
                       (long)local_f0 * -8 + lVar9 * 8;
              for (lVar7 = 0; lVar9 + lVar7 <= (long)local_16c.bigend.vect[0]; lVar7 = lVar7 + 1) {
                if (local_1f8.p
                    [lVar9 + (((lVar13 - local_1f8.begin.z) * local_1f8.kstride +
                              (lVar16 - local_1f8.begin.y) * local_1f8.jstride + lVar7) -
                             (long)local_1f8.begin.x)] +
                    local_1f8.p
                    [((long)(int)lVar16 - (long)local_1f8.begin.y) * local_1f8.jstride +
                     ((long)(int)lVar13 - (long)local_1f8.begin.z) * local_1f8.kstride +
                     (long)(((local_16c.smallend.vect[0] + -1) - local_1f8.begin.x) + (int)lVar7)]
                    == 1) {
                  *(double *)
                   ((long)crse.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                          super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                          _M_impl.super__Vector_impl_data._M_start + lVar7 * 8 + lVar12) =
                       *(double *)
                        ((long)crse.
                               super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                               super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar7 * 8 + lVar12) *
                       local_1b0;
                }
              }
            }
          }
          lVar11 = lVar11 + 8;
        }
        lVar9 = (long)local_188.smallend.vect[0];
        lVar11 = 0;
        for (uVar8 = 0; lVar13 = (long)local_188.smallend.vect[2], uVar8 != uVar15;
            uVar8 = uVar8 + 1) {
          for (; lVar16 = (long)local_188.smallend.vect[1], iVar14 = local_188.smallend.vect[1] + -1
              , (int)lVar13 <= local_188.bigend.vect[2]; lVar13 = lVar13 + 1) {
            for (; (int)lVar16 <= local_188.bigend.vect[1]; lVar16 = lVar16 + 1) {
              lVar10 = (lVar13 - local_1f8.begin.z) * local_1f8.kstride;
              lVar12 = local_d0.nstride * lVar11 +
                       (lVar16 - local_d0.begin.y) * local_d0.jstride * 8 +
                       (lVar13 - local_d0.begin.z) * local_d0.kstride * 8 +
                       (long)local_d0.begin.x * -8 + lVar9 * 8;
              for (lVar7 = 0; lVar9 + lVar7 <= (long)local_188.bigend.vect[0]; lVar7 = lVar7 + 1) {
                if (*(int *)((long)local_1f8.p +
                            lVar7 * 4 +
                            (lVar16 - local_1f8.begin.y) * local_1f8.jstride * 4 + lVar10 * 4 +
                            (long)local_1f8.begin.x * -4 + lVar9 * 4) +
                    *(int *)((long)local_1f8.p +
                            lVar7 * 4 +
                            (long)(iVar14 - local_1f8.begin.y) * local_1f8.jstride * 4 + lVar10 * 4
                            + (long)local_1f8.begin.x * -4 + lVar9 * 4) == 1) {
                  *(double *)((long)local_d0.p + lVar7 * 8 + lVar12) =
                       *(double *)((long)local_d0.p + lVar7 * 8 + lVar12) * local_1b0;
                }
              }
              iVar14 = iVar14 + 1;
            }
          }
          lVar11 = lVar11 + 8;
        }
        lVar9 = (long)local_1a4.smallend.vect[0];
        lVar11 = 0;
        for (uVar8 = 0; lVar13 = (long)local_1a4.smallend.vect[2],
            iVar14 = local_1a4.smallend.vect[2] + -1, uVar8 != uVar15; uVar8 = uVar8 + 1) {
          for (; lVar16 = (long)local_1a4.smallend.vect[1], (int)lVar13 <= local_1a4.bigend.vect[2];
              lVar13 = lVar13 + 1) {
            for (; (int)lVar16 <= local_1a4.bigend.vect[1]; lVar16 = lVar16 + 1) {
              lVar10 = (lVar16 - local_1f8.begin.y) * local_1f8.jstride;
              lVar7 = local_138 * lVar11 +
                      (lVar16 - local_12c) * CONCAT44(uStack_144,ratio.vect[2]) * 8 +
                      (lVar13 - local_128) * local_140 * 8 + (long)local_130 * -8 +
                      ratio.vect._0_8_ + lVar9 * 8;
              for (lVar12 = 0; lVar9 + lVar12 <= (long)local_1a4.bigend.vect[0]; lVar12 = lVar12 + 1
                  ) {
                if (*(int *)((long)local_1f8.p +
                            lVar12 * 4 +
                            lVar10 * 4 + (lVar13 - local_1f8.begin.z) * local_1f8.kstride * 4 +
                            (long)local_1f8.begin.x * -4 + lVar9 * 4) +
                    *(int *)((long)local_1f8.p +
                            lVar12 * 4 +
                            (long)(iVar14 - local_1f8.begin.z) * local_1f8.kstride * 4 + lVar10 * 4
                            + (long)local_1f8.begin.x * -4 + lVar9 * 4) == 1) {
                  *(double *)(lVar7 + lVar12 * 8) = *(double *)(lVar7 + lVar12 * 8) * local_1b0;
                }
              }
            }
            iVar14 = iVar14 + 1;
          }
          lVar11 = lVar11 + 8;
        }
        MFIter::operator++((MFIter *)&fine);
      }
      MFIter::~MFIter((MFIter *)&fine);
    }
  }
  return;
}

Assistant:

void
MLABecLaplacian::averageDownCoeffsSameAmrLevel (int amrlev, Vector<MultiFab>& a,
                                                Vector<Array<MultiFab,AMREX_SPACEDIM> >& b)
{
    int nmglevs = a.size();
    for (int mglev = 1; mglev < nmglevs; ++mglev)
    {
        IntVect ratio = (amrlev > 0) ? IntVect(mg_coarsen_ratio) : mg_coarsen_ratio_vec[mglev-1];

        if (m_a_scalar == 0.0)
        {
            a[mglev].setVal(0.0);
        }
        else
        {
            amrex::average_down(a[mglev-1], a[mglev], 0, 1, ratio);
        }

        Vector<const MultiFab*> fine {AMREX_D_DECL(&(b[mglev-1][0]),
                                                   &(b[mglev-1][1]),
                                                   &(b[mglev-1][2]))};
        Vector<MultiFab*> crse {AMREX_D_DECL(&(b[mglev][0]),
                                             &(b[mglev][1]),
                                             &(b[mglev][2]))};

        amrex::average_down_faces(fine, crse, ratio, 0);
    }

    for (int mglev = 1; mglev < nmglevs; ++mglev)
    {
        if (m_overset_mask[amrlev][mglev]) {
            const Real fac = static_cast<Real>(1 << mglev); // 2**mglev
            const Real osfac = Real(2.0)*fac/(fac+Real(1.0));
            const int ncomp = getNComp();
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(a[mglev],TilingIfNotGPU()); mfi.isValid(); ++mfi)
            {
                AMREX_D_TERM(Box const& xbx = mfi.nodaltilebox(0);,
                             Box const& ybx = mfi.nodaltilebox(1);,
                             Box const& zbx = mfi.nodaltilebox(2));
                AMREX_D_TERM(Array4<Real> const& bx = b[mglev][0].array(mfi);,
                             Array4<Real> const& by = b[mglev][1].array(mfi);,
                             Array4<Real> const& bz = b[mglev][2].array(mfi));
                Array4<int const> const& osm = m_overset_mask[amrlev][mglev]->const_array(mfi);
                AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM
                    (xbx, t_xbx,
                     {
                         overset_rescale_bcoef_x(t_xbx, bx, osm, ncomp, osfac);
                     },
                     ybx, t_ybx,
                     {
                         overset_rescale_bcoef_y(t_ybx, by, osm, ncomp, osfac);
                     },
                     zbx, t_zbx,
                     {
                         overset_rescale_bcoef_z(t_zbx, bz, osm, ncomp, osfac);
                     });
            }
        }
    }
}